

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O2

string * getCssClass_abi_cxx11_(string *__return_storage_ptr__,size_t totalTests,size_t passedTests)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (totalTests == passedTests) {
    __s = "allPassed";
    __a = &local_9;
  }
  else if (passedTests < totalTests * 3 >> 2) {
    if (passedTests < (totalTests >> 1 & 0x3fffffffffffffff)) {
      if (passedTests < totalTests >> 2) {
        __s = "fewPassed";
        __a = &local_d;
      }
      else {
        __s = "somePassed";
        __a = &local_c;
      }
    }
    else {
      __s = "manyPassed";
      __a = &local_b;
    }
  }
  else {
    __s = "mostPassed";
    __a = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getCssClass(const std::size_t totalTests, const std::size_t passedTests) {
  if (totalTests == passedTests) {
    return "allPassed";
  }
  if (passedTests >= ((totalTests * 3) / 4)) {
    return "mostPassed";
  }
  if (passedTests >= ((totalTests * 2) / 4)) {
    return "manyPassed";
  }
  if (passedTests >= ((totalTests * 1) / 4)) {
    return "somePassed";
  }
  return "fewPassed";
}